

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O2

void __thiscall
MultiBodyInplaceSolverIslandCallback::MultiBodyInplaceSolverIslandCallback
          (MultiBodyInplaceSolverIslandCallback *this,btMultiBodyConstraintSolver *solver,
          btDispatcher *dispatcher)

{
  (this->super_IslandCallback)._vptr_IslandCallback =
       (_func_int **)&PTR__MultiBodyInplaceSolverIslandCallback_001f20a0;
  this->m_solverInfo = (btContactSolverInfo *)0x0;
  this->m_solver = solver;
  this->m_multiBodySortedConstraints = (btMultiBodyConstraint **)0x0;
  this->m_numConstraints = 0;
  this->m_debugDrawer = (btIDebugDraw *)0x0;
  this->m_dispatcher = dispatcher;
  (this->m_bodies).m_ownsMemory = true;
  (this->m_bodies).m_data = (btCollisionObject **)0x0;
  (this->m_bodies).m_size = 0;
  (this->m_bodies).m_capacity = 0;
  (this->m_manifolds).m_ownsMemory = true;
  (this->m_manifolds).m_data = (btPersistentManifold **)0x0;
  (this->m_manifolds).m_size = 0;
  (this->m_manifolds).m_capacity = 0;
  (this->m_constraints).m_ownsMemory = true;
  (this->m_constraints).m_data = (btTypedConstraint **)0x0;
  (this->m_constraints).m_size = 0;
  (this->m_constraints).m_capacity = 0;
  (this->m_multiBodyConstraints).m_ownsMemory = true;
  (this->m_multiBodyConstraints).m_data = (btMultiBodyConstraint **)0x0;
  (this->m_multiBodyConstraints).m_size = 0;
  (this->m_multiBodyConstraints).m_capacity = 0;
  return;
}

Assistant:

MultiBodyInplaceSolverIslandCallback(	btMultiBodyConstraintSolver*	solver,
									btDispatcher* dispatcher)
		:m_solverInfo(NULL),
		m_solver(solver),
		m_multiBodySortedConstraints(NULL),
		m_numConstraints(0),
		m_debugDrawer(NULL),
		m_dispatcher(dispatcher)
	{

	}